

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O0

void __thiscall PathAlias::PathAlias(PathAlias *this,char *path)

{
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *path_local;
  PathAlias *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,path,&local_39);
  PathAlias(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

PathAlias(const char* path) : PathAlias(std::string(path)) {}